

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O2

bool Kumu::PathResolveLinks(string *link_path,string *resolved_path,char separator)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  ssize_t sVar3;
  int *piVar4;
  ILogSink *this;
  char *pcVar5;
  _List_node_base *p_Var6;
  allocator<char> local_519;
  _List_node_base *local_518;
  string next_link;
  string tmp_path;
  PathCompList_t out_list;
  PathCompList_t in_list;
  string local_498;
  string local_478;
  string local_458;
  char link_buf [1024];
  
  in_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&in_list;
  in_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  out_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&out_list;
  out_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  out_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       out_list.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  in_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       in_list.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  PathMakeCanonical((string *)link_buf,link_path,'/');
  PathToComponents((string *)link_buf,&in_list,separator);
  std::__cxx11::string::~string((string *)link_buf);
  local_518 = (_List_node_base *)&in_list;
  do {
    p_Var6 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_518->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)&in_list) {
      ComponentsToAbsolutePath(&next_link,&out_list,separator);
      std::__cxx11::string::operator=((string *)resolved_path,(string *)&next_link);
      std::__cxx11::string::~string((string *)&next_link);
LAB_00112bd2:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&out_list.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_list);
      return p_Var6 == (_List_node_base *)&in_list;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1);
    local_518 = p_Var6;
    bVar2 = std::operator!=(__lhs,"..");
    if (!bVar2) {
LAB_00112c23:
      __assert_fail("*i != \"..\" && *i != \".\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                    ,0x1d5,"bool Kumu::PathResolveLinks(const std::string &, std::string &, char)");
    }
    bVar2 = std::operator!=(__lhs,".");
    if (!bVar2) goto LAB_00112c23;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&out_list,__lhs);
    while( true ) {
      ComponentsToAbsolutePath(&next_link,&out_list,separator);
      sVar3 = readlink(next_link._M_dataplus._M_p,link_buf,0x400);
      if (sVar3 == -1) break;
      if (0x3ff < sVar3) {
        __assert_fail("link_size < MaxFilePath",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                      ,0x1e6,"bool Kumu::PathResolveLinks(const std::string &, std::string &, char)"
                     );
      }
      link_buf[sVar3] = '\0';
      tmp_path._M_dataplus._M_p = (pointer)&tmp_path.field_2;
      tmp_path._M_string_length = 0;
      tmp_path.field_2._M_local_buf[0] = '\0';
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&out_list);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,link_buf,(allocator<char> *)&local_498);
      if (local_478._M_string_length == 0) {
        std::__cxx11::string::~string((string *)&local_478);
LAB_00112a95:
        PathDirname(&local_498,&next_link,'/');
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,link_buf,&local_519)
        ;
        PathJoin(&local_478,&local_498,&local_458,'/');
        std::__cxx11::string::operator=((string *)&tmp_path,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_498);
      }
      else {
        cVar1 = *local_478._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&local_478);
        if (cVar1 != '/') goto LAB_00112a95;
        std::__cxx11::string::assign((char *)&tmp_path);
      }
      PathMakeCanonical(&local_478,&tmp_path,'/');
      PathToComponents(&local_478,&out_list,separator);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&tmp_path);
      std::__cxx11::string::~string((string *)&next_link);
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0x16) {
      this = DefaultLogSink();
      pcVar5 = strerror(*piVar4);
      ILogSink::Error(this,"%s: readlink: %s\n",next_link._M_dataplus._M_p,pcVar5);
      std::__cxx11::string::~string((string *)&next_link);
      p_Var6 = local_518;
      goto LAB_00112bd2;
    }
    std::__cxx11::string::~string((string *)&next_link);
  } while( true );
}

Assistant:

bool
Kumu::PathResolveLinks(const std::string& link_path, std::string& resolved_path, char separator)
{
  PathCompList_t in_list, out_list;
  PathToComponents(PathMakeCanonical(link_path), in_list, separator);
  PathCompList_t::iterator i;
  char link_buf[MaxFilePath];

  for ( i = in_list.begin(); i != in_list.end(); ++i )
    {
      assert ( *i != ".." && *i != "." );
      out_list.push_back(*i);

      for (;;)
	{
	  std::string next_link = ComponentsToAbsolutePath(out_list, separator);
	  ssize_t link_size = readlink(next_link.c_str(), link_buf, MaxFilePath);

	  if ( link_size == -1 )
	    {
	      if ( errno == EINVAL )
		break;

	      DefaultLogSink().Error("%s: readlink: %s\n", next_link.c_str(), strerror(errno));
	      return false;
	    }
	  
	  assert(link_size < MaxFilePath);
	  link_buf[link_size] = 0;
	  std::string tmp_path;
	  out_list.clear();

	  if ( PathIsAbsolute(link_buf) )
	    {
	      tmp_path = link_buf;
	    }
	  else
	    {
	      tmp_path = PathJoin(PathDirname(next_link), link_buf);
	    }

	  PathToComponents(PathMakeCanonical(tmp_path), out_list, separator);
	}
    }

  resolved_path = ComponentsToAbsolutePath(out_list, separator);
  return true;
}